

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O1

void __thiscall
TEST_MockExpectedCall_callWithStringParameter_Test::testBody
          (TEST_MockExpectedCall_callWithStringParameter_Test *this)

{
  MockCheckedExpectedCall *pMVar1;
  UtestShell *pUVar2;
  char *pcVar3;
  TestTerminator *pTVar4;
  SimpleString paramName;
  SimpleString local_78;
  MockNamedValue local_68;
  
  SimpleString::SimpleString(&local_78,"paramName");
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x13])(pMVar1,&local_78,"hello world");
  pUVar2 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x28])(&local_68,pMVar1,&local_78);
  pcVar3 = SimpleString::asCharString((SimpleString *)&local_68);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[9])
            (pUVar2,"const char*",pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x120,pTVar4);
  SimpleString::~SimpleString((SimpleString *)&local_68);
  pUVar2 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x26])(&local_68,pMVar1,&local_78);
  pcVar3 = MockNamedValue::getStringValue(&local_68);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[9])
            (pUVar2,"hello world",pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x121,pTVar4);
  MockNamedValue::~MockNamedValue(&local_68);
  pUVar2 = UtestShell::getCurrent();
  (*(((this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call)->super_MockExpectedCall).
    _vptr_MockExpectedCall[0x3c])(&local_68);
  pcVar3 = SimpleString::asCharString((SimpleString *)&local_68);
  (*pUVar2->_vptr_UtestShell[0xc])
            (pUVar2,"funcName -> const char* paramName: <hello world>",pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x122);
  SimpleString::~SimpleString((SimpleString *)&local_68);
  SimpleString::~SimpleString(&local_78);
  return;
}

Assistant:

TEST(MockExpectedCall, callWithStringParameter)
{
    const SimpleString paramName = "paramName";
    const char* value = "hello world";
    call->withParameter(paramName, value);
    STRCMP_EQUAL("const char*", call->getInputParameterType(paramName).asCharString());
    STRCMP_EQUAL(value, call->getInputParameter(paramName).getStringValue());
    STRCMP_CONTAINS("funcName -> const char* paramName: <hello world>", call->callToString().asCharString());
}